

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[6],int,char>(JObject *this,char (*k) [6],int *v,char *c)

{
  ostream *os;
  JSON<pstack::Field<char[6],_int>,_char> local_48;
  undefined1 local_38 [8];
  Field<char[6],_int> field;
  char *c_local;
  int *v_local;
  char (*k_local) [6];
  JObject *this_local;
  
  field.v = (int *)c;
  Field<char[6],_int>::Field((Field<char[6],_int> *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[6],int>,char>((Field<char[6],_int> *)local_38,(char *)field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }